

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O0

void PutBits(INT32 Number,UINT32 Value)

{
  UINT8 *pUVar1;
  INT32 IStack_c;
  UINT8 Temp;
  UINT32 Value_local;
  INT32 Number_local;
  
  IStack_c = Number;
  while (mBitCount <= IStack_c) {
    IStack_c = IStack_c - mBitCount;
    if (mDst < mDstUpperLimit) {
      pUVar1 = mDst + 1;
      *mDst = (byte)mSubBitBuf | (byte)(Value >> ((byte)IStack_c & 0x1f));
      mDst = pUVar1;
    }
    mCompSize = mCompSize + 1;
    mSubBitBuf = 0;
    mBitCount = 8;
  }
  mBitCount = mBitCount - IStack_c;
  mSubBitBuf = Value << ((byte)mBitCount & 0x1f) | mSubBitBuf;
  return;
}

Assistant:

STATIC 
VOID 
PutBits (
  IN INT32 n, 
  IN UINT32 x
  )
/*++

Routine Description:

  Outputs rightmost n bits of x

Argments:

  n   - the rightmost n bits of the data is used
  x   - the data 

Returns: (VOID)

--*/
{
  UINT8 Temp;  
  
  if (n < mBitCount) {
    mSubBitBuf |= x << (mBitCount -= n);
  } else {
      
    Temp = (UINT8)(mSubBitBuf | (x >> (n -= mBitCount)));
    if (mDst < mDstUpperLimit) {
      *mDst++ = Temp;
    }
    mCompSize++;

    if (n < UINT8_BIT) {
      mSubBitBuf = x << (mBitCount = UINT8_BIT - n);
    } else {
        
      Temp = (UINT8)(x >> (n - UINT8_BIT));
      if (mDst < mDstUpperLimit) {
        *mDst++ = Temp;
      }
      mCompSize++;
      
      mSubBitBuf = x << (mBitCount = 2 * UINT8_BIT - n);
    }
  }
}